

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.cpp
# Opt level: O1

void __thiscall
Centaurus::CompositeATN<char>::build_departure_set_r
          (CompositeATN<char> *this,CATNDepartureSetFactory<char> *deptset_factory,ATNPath *path,
          int color,PriorityChain *priority,ATNStateStack *stack)

{
  int iVar1;
  pointer pNVar2;
  CATNNode<char> *pCVar3;
  pointer pNVar4;
  ATNPath path_1;
  int local_54;
  ATNPath local_50;
  
  pCVar3 = get_node(this,path);
  pNVar4 = (pCVar3->m_transitions).
           super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar4 == (pCVar3->m_transitions).
                super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    ATNPath::parent_path(&local_50,path);
    if ((int)((ulong)((long)local_50.
                            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            .
                            super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_50.
                           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                           .
                           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 == 0) {
      build_wildcard_departure_set
                (this,deptset_factory,
                 &(path->
                  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ).
                  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].first,color,priority,stack);
    }
    else {
      build_departure_set_r(this,deptset_factory,&local_50,color,priority,stack);
    }
    std::
    vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
    ::~vector(&local_50.
               super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
             );
  }
  else {
    pNVar2 = (pCVar3->m_transitions).
             super__Vector_base<Centaurus::NFATransition<char>,_std::allocator<Centaurus::NFATransition<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pNVar4 != pNVar2) {
      do {
        if ((pNVar4->m_label).m_ranges.
            super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (pNVar4->m_label).m_ranges.
            super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          iVar1 = pNVar4->m_dest;
          std::
          vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ::vector(&local_50.
                    super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   ,&path->
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                  );
          local_50._vptr_ATNPath = (_func_int **)&PTR__ATNPath_0019ba38;
          local_50.
          super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          .
          super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].second = iVar1;
          local_54 = color;
          std::vector<Centaurus::CATNDeparture<char>,std::allocator<Centaurus::CATNDeparture<char>>>
          ::
          emplace_back<Centaurus::CharClass<char>const&,Centaurus::ATNPath_const&,int&,Centaurus::PriorityChain_const&>
                    ((vector<Centaurus::CATNDeparture<char>,std::allocator<Centaurus::CATNDeparture<char>>>
                      *)&deptset_factory->m_departures,&pNVar4->m_label,&local_50,&local_54,priority
                    );
          std::
          vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          ::~vector(&local_50.
                     super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
                   );
        }
        pNVar4 = pNVar4 + 1;
      } while (pNVar4 != pNVar2);
    }
  }
  return;
}

Assistant:

void CompositeATN<TCHAR>::build_departure_set_r(CATNDepartureSetFactory<TCHAR>& deptset_factory, const ATNPath& path, int color, const PriorityChain& priority, ATNStateStack& stack) const
{
    const CATNNode<TCHAR>& node = get_node(path);

    if (node.is_stop_node())
    {
        ATNPath parent_path = path.parent_path();

        if (parent_path.depth() == 0)
        {
            build_wildcard_departure_set(deptset_factory, path.leaf_id(), color, priority, stack);
        }
        else
        {
            build_departure_set_r(deptset_factory, parent_path, color, priority, stack);
        }
    }
    else
    {
        for (const auto& tr : node.get_transitions())
        {
            if (!tr.is_epsilon())
            {
                deptset_factory.add(tr.label(), path.replace_index(tr.dest()), color, priority);
            }
        }
    }
}